

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTFlightData.cpp
# Opt level: O0

string * __thiscall
LTFlightData::FDKeyTy::SetKey_abi_cxx11_(FDKeyTy *this,FDKeyType _eType,unsigned_long _num)

{
  LTError *pLVar1;
  string *psVar2;
  undefined8 in_RCX;
  int in_EDX;
  int *in_RSI;
  string *in_RDI;
  char buf [50];
  char local_58 [88];
  
  *in_RSI = in_EDX;
  *(undefined8 *)(in_RSI + 10) = in_RCX;
  local_58[0x20] = '\0';
  local_58[0x21] = '\0';
  local_58[0x22] = '\0';
  local_58[0x23] = '\0';
  local_58[0x24] = '\0';
  local_58[0x25] = '\0';
  local_58[0x26] = '\0';
  local_58[0x27] = '\0';
  local_58[0x28] = '\0';
  local_58[0x29] = '\0';
  local_58[0x2a] = '\0';
  local_58[0x2b] = '\0';
  local_58[0x2c] = '\0';
  local_58[0x2d] = '\0';
  local_58[0x2e] = '\0';
  local_58[0x2f] = '\0';
  local_58[0x10] = '\0';
  local_58[0x11] = '\0';
  local_58[0x12] = '\0';
  local_58[0x13] = '\0';
  local_58[0x14] = '\0';
  local_58[0x15] = '\0';
  local_58[0x16] = '\0';
  local_58[0x17] = '\0';
  local_58[0x18] = '\0';
  local_58[0x19] = '\0';
  local_58[0x1a] = '\0';
  local_58[0x1b] = '\0';
  local_58[0x1c] = '\0';
  local_58[0x1d] = '\0';
  local_58[0x1e] = '\0';
  local_58[0x1f] = '\0';
  local_58[0] = '\0';
  local_58[1] = '\0';
  local_58[2] = '\0';
  local_58[3] = '\0';
  local_58[4] = '\0';
  local_58[5] = '\0';
  local_58[6] = '\0';
  local_58[7] = '\0';
  local_58[8] = '\0';
  local_58[9] = '\0';
  local_58[10] = '\0';
  local_58[0xb] = '\0';
  local_58[0xc] = '\0';
  local_58[0xd] = '\0';
  local_58[0xe] = '\0';
  local_58[0xf] = '\0';
  local_58[0x30] = '\0';
  local_58[0x31] = '\0';
  switch(in_EDX) {
  case 0:
    if (*in_RSI == 0) {
      pLVar1 = (LTError *)__cxa_allocate_exception(0x18);
      LTError::LTError(pLVar1,
                       "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTFlightData.cpp"
                       ,0x115,"SetKey",logFATAL,"ASSERT FAILED: %s","eKeyType!=KEY_UNKNOWN");
      __cxa_throw(pLVar1,&LTError::typeinfo,LTError::~LTError);
    }
    break;
  case 1:
  case 2:
    snprintf(local_58,0x32,"%08lX",in_RCX);
    break;
  case 3:
  case 4:
  case 5:
  case 6:
    snprintf(local_58,0x32,"%06lX",in_RCX);
    break;
  case 7:
    snprintf(local_58,0x32,"%lu",in_RCX);
  }
  if (local_58[0] != '\0') {
    psVar2 = (string *)std::__cxx11::string::operator=((string *)(in_RSI + 2),local_58);
    std::__cxx11::string::string((string *)in_RDI,psVar2);
    return in_RDI;
  }
  pLVar1 = (LTError *)__cxa_allocate_exception(0x18);
  LTError::LTError(pLVar1,
                   "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTFlightData.cpp"
                   ,0x118,"SetKey",logFATAL,"ASSERT FAILED: %s","buf[0]");
  __cxa_throw(pLVar1,&LTError::typeinfo,LTError::~LTError);
}

Assistant:

std::string LTFlightData::FDKeyTy::SetKey (FDKeyType _eType, unsigned long _num)
{
    eKeyType = _eType;
    num = _num;

    // convert to uppercase hex string
    char buf[50] = "";
    switch(_eType) {
        case KEY_ICAO:
        case KEY_FLARM:
        case KEY_FSC:
        case KEY_ADSBEX:
            snprintf(buf, sizeof(buf), "%06lX", _num);
            break;
        case KEY_OGN:
        case KEY_RT:
            snprintf(buf, sizeof(buf), "%08lX", _num);
            break;
        case KEY_SAYINTENTIONS:
            snprintf(buf, sizeof(buf), "%lu", _num);
            break;
        case KEY_UNKNOWN:
            // must not happen
            LOG_ASSERT(eKeyType!=KEY_UNKNOWN);
            break;
    }
    LOG_ASSERT(buf[0]);
    return key = buf;
}